

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void * new<Memory::NoThrowHeapAllocator>
                 (size_t byteSize,NoThrowHeapAllocator *alloc,bool nothrow,AllocFuncType AllocFunc,
                 size_t plusSize)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void *pvVar4;
  undefined7 in_register_00000011;
  long lVar5;
  ulong in_R9;
  
  if ((int)CONCAT71(in_register_00000011,nothrow) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x22f,"(nothrow)","nothrow");
    if (!bVar2) goto LAB_0066217e;
    *puVar3 = 0;
  }
  if (byteSize == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x230,"(byteSize != 0)","byteSize != 0");
    if (!bVar2) {
LAB_0066217e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((AllocFunc & 1) != 0) {
    AllocFunc = *(undefined8 *)(*(long *)(alloc + plusSize) + -1 + AllocFunc);
  }
  lVar5 = -1;
  if (!CARRY8(in_R9,byteSize)) {
    lVar5 = in_R9 + byteSize;
  }
  pvVar4 = (void *)(*(code *)AllocFunc)(alloc + plusSize,lVar5);
  return pvVar4;
}

Assistant:

__cdecl
operator new(DECLSPEC_GUARD_OVERFLOW size_t byteSize, TAllocator * alloc, bool nothrow, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t plusSize)
{
    Assert(nothrow);
    Assert(byteSize != 0);
    //Assert(plusSize != 0);
    // byteSize is usually a compile-time constant, so put it on the RHS of the add for
    // slightly better (smaller and faster) code.
    void * buffer = (alloc->*AllocFunc)(AllocSizeMath::Add(plusSize, byteSize));
    return buffer;
}